

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O1

void __thiscall FFlatVertexBuffer::CreateVBO(FFlatVertexBuffer *this)

{
  uint uVar1;
  FFlatVertex *pFVar2;
  
  TArray<FFlatVertex,_FFlatVertex>::Resize(&this->vbo_shadowdata,this->mNumReserved);
  CreateFlatVBO(this);
  uVar1 = (this->vbo_shadowdata).Count;
  this->mIndex = uVar1;
  this->mCurIndex = uVar1;
  if (gl.buffermethod == 1) {
    (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
    gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
    pFVar2 = (FFlatVertex *)(*_ptrc_glMapBufferRange)(0x8892,0,40000000,0x22);
    this->map = pFVar2;
  }
  memcpy(this->map,(this->vbo_shadowdata).Array,(ulong)(this->vbo_shadowdata).Count * 0x14);
  if (gl.buffermethod == 1) {
    (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
    gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
    (*_ptrc_glUnmapBuffer)(0x8892);
    this->map = (FFlatVertex *)0x0;
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CreateVBO()
{
	vbo_shadowdata.Resize(mNumReserved);
	CreateFlatVBO();
	mCurIndex = mIndex = vbo_shadowdata.Size();
	Map();
	memcpy(map, &vbo_shadowdata[0], vbo_shadowdata.Size() * sizeof(FFlatVertex));
	Unmap();
}